

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O1

void __thiscall
DigitalConsumer_python::DigitalConsumer_python
          (DigitalConsumer_python *this,HighFreqDataType *hf,int ringbufsize,
          HFParsingInfo *parseargs)

{
  allocator_type local_f3;
  value_type_conflict3 local_f2;
  HFParsingInfo local_f0;
  HighFreqDataType local_b0;
  
  HighFreqDataType::HighFreqDataType(&local_b0,hf);
  std::vector<int,_std::allocator<int>_>::vector(&local_f0.indices,&parseargs->indices);
  local_f0.sizeOf = parseargs->sizeOf;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f0.dataRequested,&parseargs->dataRequested);
  local_f0.dataLength = parseargs->dataLength;
  DigitalConsumer::DigitalConsumer(&this->super_DigitalConsumer,&local_b0,ringbufsize,&local_f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f0.dataRequested);
  if (local_f0.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_f0.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  HighFreqDataType::~HighFreqDataType(&local_b0);
  (this->super_wrapper<DigitalConsumer>).super_wrapper_base.m_self = (PyObject *)0x0;
  (this->super_DigitalConsumer).super_HFSubConsumer.super_HighFreqSub._vptr_HighFreqSub =
       (_func_int **)&PTR__DigitalConsumer_python_003ee390;
  local_f2 = 0;
  std::vector<short,_std::allocator<short>_>::vector
            (&this->data,
             (ulong)((long)(parseargs->indices).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(parseargs->indices).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2) >> 1,&local_f2,&local_f3);
  __Py_NoneStruct = __Py_NoneStruct + 1;
  (this->owner).super_object_base.m_ptr = (PyObject *)&_Py_NoneStruct;
  return;
}

Assistant:

DigitalConsumer_python(HighFreqDataType hf, int ringbufsize, HFParsingInfo parseargs)
        : DigitalConsumer(hf, ringbufsize, parseargs),
          data(parseargs.indices.size()/2, 0){}